

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O3

Expression * __thiscall wasm::AlignmentLowering::lowerLoadI32(AlignmentLowering *this,Load *curr)

{
  ulong uVar1;
  Module *pMVar2;
  uintptr_t uVar3;
  address64_t aVar4;
  undefined1 auVar5 [16];
  Index IVar6;
  Memory *pMVar7;
  undefined4 *puVar8;
  Expression *pEVar9;
  Expression *pEVar10;
  Const *pCVar11;
  Binary *pBVar12;
  Binary *pBVar13;
  Binary *this_00;
  Type in_R8;
  MixedArena *pMVar14;
  LocalSet *local_80;
  Binary *local_78;
  Binary *local_70;
  initializer_list<wasm::Expression_*> local_68;
  ulong local_50;
  Name *local_48;
  Builder local_40;
  Builder builder;
  
  uVar1 = (curr->align).addr;
  if ((uVar1 != 0) && (uVar1 != curr->bytes)) {
    pMVar7 = Module::getMemory((this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currModule,(Name)(curr->memory).super_IString.str);
    local_50 = (pMVar7->indexType).id;
    pMVar2 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
             ).
             super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
             .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
             currModule;
    local_40.wasm = pMVar2;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id != 2) {
      __assert_fail("curr->type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                    ,0x28,"Expression *wasm::AlignmentLowering::lowerLoadI32(Load *)");
    }
    local_48 = &curr->memory;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_50;
    IVar6 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
    builder.wasm._4_4_ = IVar6;
    if (curr->bytes == '\x04') {
      aVar4 = (curr->align).addr;
      if (aVar4 == 2) {
        aVar4 = (curr->offset).addr;
        pMVar14 = &pMVar2->allocator;
        puVar8 = (undefined4 *)MixedArena::allocSpace(pMVar14,0x18,8);
        *puVar8 = 8;
        puVar8[4] = IVar6;
        *(ulong *)(puVar8 + 2) = local_50;
        local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(pMVar14,0x48,8);
        pEVar9->_id = LoadId;
        *(undefined1 *)&pEVar9[2].type.id = 0;
        *(undefined2 *)&pEVar9[1]._id = IfId;
        pEVar9[1].type.id = aVar4;
        *(undefined8 *)(pEVar9 + 2) = 2;
        *(undefined4 **)(pEVar9 + 3) = puVar8;
        (pEVar9->type).id = 2;
        pEVar9[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar9 + 4) = local_68._M_len;
        local_70 = (Binary *)((curr->offset).addr + 2);
        puVar8 = (undefined4 *)MixedArena::allocSpace(pMVar14,0x18,8);
        *puVar8 = 8;
        puVar8[4] = builder.wasm._4_4_;
        *(ulong *)(puVar8 + 2) = local_50;
        local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
        pEVar10 = (Expression *)MixedArena::allocSpace(pMVar14,0x48,8);
        pEVar10->_id = LoadId;
        *(undefined1 *)&pEVar10[2].type.id = 0;
        *(undefined2 *)&pEVar10[1]._id = IfId;
        pEVar10[1].type.id = (uintptr_t)local_70;
        *(undefined8 *)(pEVar10 + 2) = 2;
        *(undefined4 **)(pEVar10 + 3) = puVar8;
        (pEVar10->type).id = 2;
        pEVar10[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar10 + 4) = local_68._M_len;
        pCVar11 = Builder::makeConst<int>(&local_40,0x10);
        pBVar12 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar12->op = ShlInt32;
        pBVar12->left = pEVar10;
        pBVar12->right = (Expression *)pCVar11;
        Binary::finalize(pBVar12);
        pBVar13 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar13->op = OrInt32;
        pBVar13->left = pEVar9;
        pBVar13->right = (Expression *)pBVar12;
      }
      else {
        if (aVar4 != 1) {
          handle_unreachable("invalid alignment",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                             ,0x84);
        }
        uVar3 = (curr->offset).addr;
        pMVar14 = &pMVar2->allocator;
        puVar8 = (undefined4 *)MixedArena::allocSpace(pMVar14,0x18,8);
        *puVar8 = 8;
        puVar8[4] = IVar6;
        *(ulong *)(puVar8 + 2) = local_50;
        local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(pMVar14,0x48,8);
        pEVar9->_id = LoadId;
        *(undefined1 *)&pEVar9[2].type.id = 0;
        *(undefined2 *)&pEVar9[1]._id = BlockId;
        pEVar9[1].type.id = uVar3;
        *(undefined8 *)(pEVar9 + 2) = 1;
        *(undefined4 **)(pEVar9 + 3) = puVar8;
        (pEVar9->type).id = 2;
        pEVar9[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar9 + 4) = local_68._M_len;
        local_70 = (Binary *)((curr->offset).addr + 1);
        puVar8 = (undefined4 *)MixedArena::allocSpace(pMVar14,0x18,8);
        *puVar8 = 8;
        puVar8[4] = builder.wasm._4_4_;
        *(ulong *)(puVar8 + 2) = local_50;
        local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
        pEVar10 = (Expression *)MixedArena::allocSpace(pMVar14,0x48,8);
        pEVar10->_id = LoadId;
        *(undefined1 *)&pEVar10[2].type.id = 0;
        *(undefined2 *)&pEVar10[1]._id = BlockId;
        pEVar10[1].type.id = (uintptr_t)local_70;
        *(undefined8 *)(pEVar10 + 2) = 1;
        *(undefined4 **)(pEVar10 + 3) = puVar8;
        (pEVar10->type).id = 2;
        pEVar10[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar10 + 4) = local_68._M_len;
        pCVar11 = Builder::makeConst<int>(&local_40,8);
        pBVar13 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar13->op = ShlInt32;
        pBVar13->left = pEVar10;
        pBVar13->right = (Expression *)pCVar11;
        Binary::finalize(pBVar13);
        local_70 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (local_70->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (local_70->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        local_70->op = OrInt32;
        local_70->left = pEVar9;
        local_70->right = (Expression *)pBVar13;
        Binary::finalize(local_70);
        aVar4 = (curr->offset).addr;
        puVar8 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
        *puVar8 = 8;
        puVar8[4] = builder.wasm._4_4_;
        *(ulong *)(puVar8 + 2) = local_50;
        local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x48,8);
        pEVar9->_id = LoadId;
        *(undefined1 *)&pEVar9[2].type.id = 0;
        *(undefined2 *)&pEVar9[1]._id = BlockId;
        pEVar9[1].type.id = aVar4 + 2;
        *(undefined8 *)(pEVar9 + 2) = 1;
        *(undefined4 **)(pEVar9 + 3) = puVar8;
        (pEVar9->type).id = 2;
        pEVar9[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar9 + 4) = local_68._M_len;
        pCVar11 = Builder::makeConst<int>(&local_40,0x10);
        pBVar13 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar13->op = ShlInt32;
        pBVar13->left = pEVar9;
        pBVar13->right = (Expression *)pCVar11;
        Binary::finalize(pBVar13);
        aVar4 = (curr->offset).addr;
        puVar8 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
        *puVar8 = 8;
        puVar8[4] = builder.wasm._4_4_;
        *(ulong *)(puVar8 + 2) = local_50;
        local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x48,8);
        pEVar9->_id = LoadId;
        *(undefined1 *)&pEVar9[2].type.id = 0;
        *(undefined2 *)&pEVar9[1]._id = BlockId;
        pEVar9[1].type.id = aVar4 + 3;
        *(undefined8 *)(pEVar9 + 2) = 1;
        *(undefined4 **)(pEVar9 + 3) = puVar8;
        (pEVar9->type).id = 2;
        pEVar9[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar9 + 4) = local_68._M_len;
        pCVar11 = Builder::makeConst<int>(&local_40,0x18);
        pBVar12 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar12->op = ShlInt32;
        pBVar12->left = pEVar9;
        pBVar12->right = (Expression *)pCVar11;
        Binary::finalize(pBVar12);
        this_00 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_00->op = OrInt32;
        this_00->left = (Expression *)pBVar13;
        this_00->right = (Expression *)pBVar12;
        Binary::finalize(this_00);
        pBVar13 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar13->op = OrInt32;
        pBVar13->left = (Expression *)local_70;
        pBVar13->right = (Expression *)this_00;
      }
      Binary::finalize(pBVar13);
    }
    else {
      local_70 = (Binary *)this;
      if (curr->bytes != '\x02') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0x87);
      }
      uVar3 = (curr->offset).addr;
      pMVar14 = &pMVar2->allocator;
      puVar8 = (undefined4 *)MixedArena::allocSpace(pMVar14,0x18,8);
      *puVar8 = 8;
      puVar8[4] = IVar6;
      *(ulong *)(puVar8 + 2) = local_50;
      local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
      local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
      pEVar9 = (Expression *)MixedArena::allocSpace(pMVar14,0x48,8);
      pEVar9->_id = LoadId;
      *(undefined1 *)&pEVar9[2].type.id = 0;
      *(undefined2 *)&pEVar9[1]._id = BlockId;
      pEVar9[1].type.id = uVar3;
      *(undefined8 *)(pEVar9 + 2) = 1;
      *(undefined4 **)(pEVar9 + 3) = puVar8;
      (pEVar9->type).id = 2;
      pEVar9[3].type.id = (uintptr_t)local_68._M_array;
      *(size_type *)(pEVar9 + 4) = local_68._M_len;
      aVar4 = (curr->offset).addr;
      puVar8 = (undefined4 *)MixedArena::allocSpace(pMVar14,0x18,8);
      *puVar8 = 8;
      puVar8[4] = builder.wasm._4_4_;
      *(ulong *)(puVar8 + 2) = local_50;
      local_68._M_array = (iterator)(local_48->super_IString).str._M_len;
      local_68._M_len = (size_type)(local_48->super_IString).str._M_str;
      pEVar10 = (Expression *)MixedArena::allocSpace(pMVar14,0x48,8);
      pEVar10->_id = LoadId;
      *(undefined1 *)&pEVar10[2].type.id = 0;
      *(undefined2 *)&pEVar10[1]._id = BlockId;
      pEVar10[1].type.id = aVar4 + 1;
      *(undefined8 *)(pEVar10 + 2) = 1;
      *(undefined4 **)(pEVar10 + 3) = puVar8;
      (pEVar10->type).id = 2;
      pEVar10[3].type.id = (uintptr_t)local_68._M_array;
      *(size_type *)(pEVar10 + 4) = local_68._M_len;
      pCVar11 = Builder::makeConst<int>(&local_40,8);
      pBVar12 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar12->op = ShlInt32;
      pBVar12->left = pEVar10;
      pBVar12->right = (Expression *)pCVar11;
      Binary::finalize(pBVar12);
      pBVar13 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
      (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar13->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar13->op = OrInt32;
      pBVar13->left = pEVar9;
      pBVar13->right = (Expression *)pBVar12;
      Binary::finalize(pBVar13);
      if (curr->signed_ == true) {
        pBVar13 = (Binary *)Bits::makeSignExt((Expression *)pBVar13,2,*(Module **)&local_70[6].op);
      }
    }
    local_80 = Builder::makeLocalSet(&local_40,builder.wasm._4_4_,curr->ptr);
    local_68._M_array = (iterator)&local_80;
    local_68._M_len = 2;
    local_78 = pBVar13;
    curr = (Load *)Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_40,&local_68);
  }
  return (Expression *)curr;
}

Assistant:

Expression* lowerLoadI32(Load* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    Builder builder(*getModule());
    assert(curr->type == Type::i32);
    auto temp = builder.addVar(getFunction(), indexType);
    Expression* ret;
    if (curr->bytes == 2) {
      ret = builder.makeBinary(
        OrInt32,
        builder.makeLoad(1,
                         false,
                         curr->offset,
                         1,
                         builder.makeLocalGet(temp, indexType),
                         Type::i32,
                         curr->memory),
        builder.makeBinary(
          ShlInt32,
          builder.makeLoad(1,
                           false,
                           curr->offset + 1,
                           1,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeConst(int32_t(8))));
      if (curr->signed_) {
        ret = Bits::makeSignExt(ret, 2, *getModule());
      }
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeBinary(
            OrInt32,
            builder.makeLoad(1,
                             false,
                             curr->offset,
                             1,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 1,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(8)))),
          builder.makeBinary(
            OrInt32,
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 2,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(16))),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 3,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(24)))));
      } else if (curr->align == 2) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeLoad(2,
                           false,
                           curr->offset,
                           2,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeBinary(
            ShlInt32,
            builder.makeLoad(2,
                             false,
                             curr->offset + 2,
                             2,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeConst(int32_t(16))));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    return builder.makeBlock({builder.makeLocalSet(temp, curr->ptr), ret});
  }